

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test7::getVariableDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,char *prefix,
          _variables *variables,char *layout_qualifier)

{
  uint uVar1;
  pointer p_Var2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  long extraout_RDX;
  uint uVar6;
  ulong uVar7;
  string variable_type_string;
  stringstream result_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
  lVar3 = (long)(variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = lVar3 % 0xc;
  for (uVar6 = 0; uVar7 = (ulong)uVar6, uVar7 < (ulong)(lVar3 / 0xc); uVar6 = uVar6 + 1) {
    p_Var2 = (variables->
             super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = p_Var2[uVar7].array_size;
    Utils::getVariableTypeString_abi_cxx11_
              (&variable_type_string,(Utils *)(ulong)p_Var2[uVar7].type,(_variable_type)lVar5);
    poVar4 = std::operator<<(&local_1a8,layout_qualifier);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)&variable_type_string);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,prefix);
    poVar4 = std::operator<<(poVar4,"_variable");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    if (1 < uVar1) {
      poVar4 = std::operator<<(&local_1a8,"[");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"]");
    }
    std::operator<<(&local_1a8,";\n");
    std::__cxx11::string::~string((string *)&variable_type_string);
    lVar5 = extraout_RDX;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getVariableDeclarations(const char* prefix, const _variables& variables,
														const char* layout_qualifier)
{
	std::stringstream result_sstream;

	/* Define output variables */
	const size_t n_variables = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size  = variables[n_variable].array_size;
		Utils::_variable_type variable_type		   = variables[n_variable].type;
		std::string			  variable_type_string = Utils::getVariableTypeString(variable_type);

		result_sstream << layout_qualifier << " " << variable_type_string << " " << prefix << "_variable" << n_variable;

		if (variable_array_size > 1)
		{
			result_sstream << "[" << variable_array_size << "]";
		}

		result_sstream << ";\n";
	} /* for (all user-specified variable types) */

	return result_sstream.str();
}